

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::set_long_option(Solver *this,char *arg)

{
  State *pSVar1;
  char *in_RSI;
  Solver *in_RDI;
  string name;
  int val;
  bool res;
  char *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  string *this_00;
  int val_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  int *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  bool local_11;
  
  require_solver_pointer_to_be_non_zero
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)0xe208c8);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set_long_option(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set_long_option(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set_long_option(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if (*pSVar1 == CONFIGURING) {
    if ((*in_RSI == '-') && (in_RSI[1] == '-')) {
      this_00 = (string *)&stack0xffffffffffffffc8;
      std::__cxx11::string::string(this_00);
      val_00 = (int)((ulong)this_00 >> 0x20);
      local_11 = Options::parse_long_option
                           (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8);
      if (local_11) {
        uVar2 = local_11;
        std::__cxx11::string::c_str();
        set(in_RDI,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),val_00);
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    }
    else {
      local_11 = false;
    }
    return local_11;
  }
  fatal_message_start();
  fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
          "bool CaDiCaL::Solver::set_long_option(const char *)",
          "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
         );
  fprintf(_stderr,"can only set option \'%s\' right after initialization",in_RSI);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::set_long_option (const char *arg) {
  LOG_API_CALL_BEGIN ("set", arg);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set option '%s' right after initialization", arg);
  bool res;
  if (arg[0] != '-' || arg[1] != '-')
    res = false;
  else {
    int val;
    string name;
    res = Options::parse_long_option (arg, name, val);
    if (res)
      set (name.c_str (), val);
  }
  LOG_API_CALL_END ("set", arg, res);
  return res;
}